

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O0

optional<double> * __thiscall
tinyusdz::primvar::PrimVar::get_default_value<double>
          (optional<double> *__return_storage_ptr__,PrimVar *this)

{
  optional<double> local_28;
  PrimVar *local_18;
  PrimVar *this_local;
  
  local_18 = this;
  this_local = (PrimVar *)__return_storage_ptr__;
  get_value<double>(&local_28,this);
  nonstd::optional_lite::optional<double>::optional<double,_0>(__return_storage_ptr__,&local_28);
  nonstd::optional_lite::optional<double>::~optional(&local_28);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_default_value() const {
    return get_value<T>();
  }